

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

Cof_Man_t * Cof_ManCreateLogicSimple(Gia_Man_t *pGia)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  Cof_Man_t *pCVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  long lVar9;
  int *__ptr;
  uint uVar10;
  uint *puVar11;
  int iVar12;
  uint Entry;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  Vec_Int_t *pVVar18;
  long lVar19;
  long lVar20;
  
  pCVar4 = (Cof_Man_t *)calloc(1,0x48);
  pCVar4->pGia = pGia;
  pVVar18 = pGia->vCis;
  iVar13 = pVVar18->nSize;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  if (iVar13 - 1U < 0xf) {
    iVar13 = 0x10;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar13;
  if (iVar13 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar13 << 2);
  }
  pVVar5->pArray = piVar6;
  pCVar4->vCis = pVVar5;
  pVVar2 = pGia->vCos;
  iVar13 = pVVar2->nSize;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar12 = iVar13;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar12;
  if (iVar12 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar7->pArray = piVar6;
  pCVar4->vCos = pVVar7;
  iVar13 = pVVar2->nSize;
  uVar1 = pGia->nObjs * 10 + iVar13 * 2 + ~(pVVar18->nSize + iVar13) * 4;
  pCVar4->nObjData = uVar1;
  piVar6 = (int *)calloc((long)(int)uVar1,4);
  pCVar4->pObjData = piVar6;
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  uVar14 = (ulong)(uint)pGia->nObjs;
  if (pGia->nObjs < 1) {
    Entry = 0;
  }
  else {
    lVar20 = 0;
    lVar19 = 8;
    Entry = 0;
    do {
      pGVar3 = pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(uint *)(&pGVar3->field_0x0 + lVar19) = Entry;
      uVar8 = (ulong)Entry;
      uVar10 = piVar6[uVar8];
      piVar6[uVar8] = uVar10 & 0xffffff0f;
      if ((int)uVar14 <= lVar20) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      puVar11 = (uint *)(piVar6 + uVar8);
      lVar9 = uVar8 * 4;
      uVar10 = uVar10 & 0xf | pGia->pRefs[lVar20] << 8;
      *puVar11 = uVar10;
      puVar11[3] = (uint)lVar20;
      puVar11[2] = 0;
      uVar14 = *(ulong *)((long)pGVar3 + lVar19 + -8);
      uVar15 = (uint)uVar14;
      uVar14 = uVar14 & 0x1fffffff;
      iVar13 = (int)uVar14;
      if (uVar14 == 0x1fffffff || (int)uVar15 < 0) {
        if ((int)uVar15 < 0 && iVar13 != 0x1fffffff) {
          uVar14 = (ulong)*(uint *)((long)pGVar3 + (ulong)(uint)(iVar13 << 2) * -3 + lVar19);
          uVar10 = (uint)(lVar9 + uVar14 * -4 >> 2) & 0x7fffffff;
          piVar6[uVar8 + 6] = piVar6[uVar8 + 6] & 0x80000000U | uVar10;
          iVar13 = piVar6[uVar14 + 2];
          piVar6[uVar14 + 2] = iVar13 + 1;
          uVar17 = (ulong)(((uint)piVar6[uVar14] >> 4 & 0xf) + iVar13);
          piVar6[uVar14 + uVar17 + 6] = piVar6[uVar14 + uVar17 + 6] & 0x80000000U | uVar10;
          uVar10 = piVar6[uVar8];
          uVar16 = uVar10 & 0xffffff0f | uVar10 + 0x10 & 0xf0;
          uVar15 = *(uint *)((long)pGVar3 + lVar19 + -8);
          piVar6[uVar8] = uVar16;
          uVar14 = (ulong)(uVar10 >> 2 & 0x3c);
          *(uint *)((long)puVar11 + uVar14 + 0x18) =
               (*(uint *)((long)puVar11 + uVar14 + 0x18) & 0x7fffffff) + (uVar15 & 0xe0000000) * 4;
          piVar6[uVar8] = uVar16 | 1;
          pVVar18 = pVVar7;
        }
        else {
          if ((~uVar15 & 0x9fffffff) != 0) goto LAB_0065e0d0;
          *puVar11 = uVar10 | 1;
          pVVar18 = pVVar5;
        }
        Vec_IntPush(pVVar18,Entry);
      }
      else {
        uVar14 = (ulong)*(uint *)((long)pGVar3 + (ulong)(uint)(iVar13 << 2) * -3 + lVar19);
        uVar10 = (uint)(lVar9 + uVar14 * -4 >> 2) & 0x7fffffff;
        piVar6[uVar8 + 6] = piVar6[uVar8 + 6] & 0x80000000U | uVar10;
        iVar13 = piVar6[uVar14 + 2];
        piVar6[uVar14 + 2] = iVar13 + 1;
        uVar17 = (ulong)(((uint)piVar6[uVar14] >> 4 & 0xf) + iVar13);
        piVar6[uVar14 + uVar17 + 6] = piVar6[uVar14 + uVar17 + 6] & 0x80000000U | uVar10;
        uVar10 = piVar6[uVar8];
        uVar15 = *(uint *)((long)pGVar3 + lVar19 + -8);
        piVar6[uVar8] = uVar10 & 0xffffff0f | uVar10 + 0x10 & 0xf0;
        uVar14 = (ulong)(uVar10 >> 2 & 0x3c);
        *(uint *)((long)puVar11 + uVar14 + 0x18) =
             (*(uint *)((long)puVar11 + uVar14 + 0x18) & 0x7fffffff) + (uVar15 & 0xe0000000) * 4;
        uVar17 = (ulong)*(uint *)((long)pGVar3 +
                                 (ulong)((*(uint *)((long)pGVar3 + lVar19 + -4) & 0x1fffffff) << 2)
                                 * -3 + lVar19);
        uVar14 = (ulong)(uVar10 + 0x10 >> 2 & 0x3c);
        uVar10 = (uint)(lVar9 + uVar17 * -4 >> 2) & 0x7fffffff;
        *(uint *)((long)puVar11 + uVar14 + 0x18) =
             *(uint *)((long)puVar11 + uVar14 + 0x18) & 0x80000000 | uVar10;
        iVar13 = piVar6[uVar17 + 2];
        piVar6[uVar17 + 2] = iVar13 + 1;
        uVar14 = (ulong)(((uint)piVar6[uVar17] >> 4 & 0xf) + iVar13);
        piVar6[uVar17 + uVar14 + 6] = piVar6[uVar17 + uVar14 + 6] & 0x80000000U | uVar10;
        uVar10 = piVar6[uVar8];
        uVar14 = *(ulong *)((long)pGVar3 + lVar19 + -8);
        piVar6[uVar8] = uVar10 & 0xffffff0f | uVar10 + 0x10 & 0xf0;
        uVar8 = (ulong)(uVar10 >> 2 & 0x3c);
        *(uint *)((long)puVar11 + uVar8 + 0x18) =
             *(uint *)((long)puVar11 + uVar8 + 0x18) & 0x7fffffff |
             (uint)(uVar14 >> 0x1e) & 0x80000000;
        pCVar4->nNodes = pCVar4->nNodes + 1;
      }
LAB_0065e0d0:
      Entry = Entry + (*puVar11 >> 8) + (*puVar11 >> 4 & 0xf) + 6;
      pCVar4->nObjs = pCVar4->nObjs + 1;
      lVar20 = lVar20 + 1;
      uVar14 = (ulong)pGia->nObjs;
      lVar19 = lVar19 + 0xc;
    } while (lVar20 < (long)uVar14);
  }
  if (Entry != uVar1) {
    __assert_fail("iHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                  ,0xb4,"Cof_Man_t *Cof_ManCreateLogicSimple(Gia_Man_t *)");
  }
  __ptr = Gia_ManCreateMuxRefs(pGia);
  uVar1 = pGia->nObjs;
  if ((0 < (int)uVar1) && (pGia->pObjs != (Gia_Obj_t *)0x0)) {
    puVar11 = &pGia->pObjs->Value;
    uVar14 = 0;
    do {
      uVar8 = (ulong)*puVar11;
      if ((uint)piVar6[uVar8] >> 8 != piVar6[uVar8 + 2]) {
        __assert_fail("pObjLog->nFanouts == pObjLog->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                      ,0xb9,"Cof_Man_t *Cof_ManCreateLogicSimple(Gia_Man_t *)");
      }
      piVar6[uVar8 + 1] = __ptr[uVar14];
      uVar14 = uVar14 + 1;
      puVar11 = puVar11 + 3;
    } while (uVar1 != uVar14);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  return pCVar4;
}

Assistant:

Cof_Man_t * Cof_ManCreateLogicSimple( Gia_Man_t * pGia )
{
    Cof_Man_t * p;
    Cof_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj;
    int * pMuxRefs;
    int i, iHandle = 0;
    p = ABC_CALLOC( Cof_Man_t, 1 );
    p->pGia = pGia;
    p->vCis = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Cof_Obj_t) / 4) * Gia_ManObjNum(pGia) + 4 * Gia_ManAndNum(pGia) + 2 * Gia_ManCoNum(pGia);
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    Gia_ManForEachObj( pGia, pObj, i )
    {
        pObj->Value = iHandle;
        pObjLog = Cof_ManObj( p, iHandle );
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->Id       = i;
        pObjLog->Value    = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin0(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC0(pObj);

            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin1(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC1(pObj);
            p->nNodes++;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin0(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC0(pObj);

            pObjLog->fTerm = 1;
            Vec_IntPush( p->vCos, iHandle );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObjLog->fTerm = 1;
            Vec_IntPush( p->vCis, iHandle );
        }
        iHandle += Cof_ObjSize( pObjLog );
        p->nObjs++;
    }
    assert( iHandle == p->nObjData );
    pMuxRefs = Gia_ManCreateMuxRefs( pGia );
    Gia_ManForEachObj( pGia, pObj, i )
    {
        pObjLog = Cof_ManObj( p, Gia_ObjHandle(pObj) );
        assert( pObjLog->nFanouts == pObjLog->Value );
        pObjLog->nFanoutsM = pMuxRefs[i];
    }
    ABC_FREE( pMuxRefs );
    return p;
}